

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::cleanup(EventLoop *this,EVP_PKEY_CTX *ctx)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  __weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer ppEVar3;
  uint uVar4;
  _Hash_node_base *p_Var5;
  sigaction local_c0;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this_00 = &localEventLoop()->super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>;
  std::__weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
  ppEVar3 = (this->mEvents).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->mEvents).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur != ppEVar3) {
    do {
      if (*ppEVar3 != (Event *)0x0) {
        (*(*ppEVar3)->_vptr_Event[1])();
      }
      std::deque<Event_*,_std::allocator<Event_*>_>::pop_front(&(this->mEvents).c);
      ppEVar3 = (this->mEvents).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
    } while ((this->mEvents).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != ppEVar3);
  }
  for (p_Var5 = (this->mTimersById)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
      p_Var5 = p_Var5->_M_nxt) {
    p_Var1 = p_Var5[1]._M_nxt;
    if ((p_Var1 != (_Hash_node_base *)0x0) && (p_Var1[5]._M_nxt != (_Hash_node_base *)0x0)) {
      (*(code *)p_Var1[5]._M_nxt)(p_Var1 + 3,p_Var1 + 3,3);
    }
    operator_delete(p_Var1);
  }
  std::
  _Hashtable<EventLoop::TimerData_*,_EventLoop::TimerData_*,_std::allocator<EventLoop::TimerData_*>,_std::__detail::_Identity,_EventLoop::TimerDataHash,_EventLoop::TimerDataHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->mTimersById)._M_h);
  std::
  _Rb_tree<EventLoop::TimerData_*,_EventLoop::TimerData_*,_std::_Identity<EventLoop::TimerData_*>,_EventLoop::TimerDataSet,_std::allocator<EventLoop::TimerData_*>_>
  ::clear(&(this->mTimersByTime)._M_t);
  this->mNextTimerId = 0;
  uVar4 = this->mFlags;
  if ((uVar4 & 6) != 0) {
    memset(&local_c0,0,0x98);
    if ((uVar4 & 2) != 0) {
      sigaction(2,&local_c0,(sigaction *)0x0);
      uVar4 = this->mFlags;
    }
    if ((uVar4 & 4) != 0) {
      sigaction(0xf,&local_c0,(sigaction *)0x0);
    }
  }
  if (this->mPollFd != -1) {
    close(this->mPollFd);
  }
  if (this->mEventPipe[0] != -1) {
    close(this->mEventPipe[0]);
  }
  if (this->mEventPipe[1] != -1) {
    close(this->mEventPipe[1]);
  }
  uVar4 = this->mFlags;
  if ((uVar4 & 1) != 0) {
    std::__weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::reset
              (&sMainLoop.super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>);
    uVar4 = this->mFlags;
  }
  if ((uVar4 & 2) != 0) {
    if ((int)sMainEventPipe.super___atomic_base<int>._M_i < 0) {
      __assert_fail("sMainEventPipe >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/EventLoop.cpp"
                    ,0x142,"void EventLoop::cleanup()");
    }
    LOCK();
    sMainEventPipe.super___atomic_base<int>._M_i = (__atomic_base<int>)-1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return;
}

Assistant:

void EventLoop::cleanup()
{
    std::lock_guard<std::mutex> locker(mMutex);
    localEventLoop().reset();

    while (!mEvents.empty()) {
        delete mEvents.front();
        mEvents.pop();
    }

    for (auto timer : mTimersById) {
        delete timer;
    }
    mTimersById.clear();
    mTimersByTime.clear();
    mNextTimerId = 0;

#ifndef _WIN32
    if (mFlags & (EnableSigIntHandler | EnableSigTermHandler)) {
        struct sigaction act;
        memset(&act, 0, sizeof act);
        act.sa_handler = SIG_DFL;

        if (mFlags & EnableSigIntHandler) {
            ::sigaction(SIGINT, &act, 0);
        }

        if (mFlags & EnableSigTermHandler) {
            ::sigaction(SIGTERM, &act, 0);
        }
    }
#endif

#if defined(HAVE_EPOLL) || defined(HAVE_KQUEUE)
    if (mPollFd != -1)
        ::close(mPollFd);
#endif

    if (mEventPipe[0] != -1)
        ::close(mEventPipe[0]);
    if (mEventPipe[1] != -1)
        ::close(mEventPipe[1]);
    if (mFlags & MainEventLoop)
        sMainLoop.reset();
#ifndef _WIN32
    if (mFlags & EnableSigIntHandler) {
        assert(sMainEventPipe >= 0);
        sMainEventPipe = -1;
    }
#endif
}